

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char_const(&)[11],kj::StringPtr&,char_const(&)[5]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [11],StringPtr *params_1,
          char (*params_2) [5])

{
  char (*value) [11];
  StringPtr *value_00;
  char (*value_01) [5];
  ArrayPtr<const_char> local_58;
  ArrayPtr<const_char> local_48;
  ArrayPtr<const_char> local_38;
  StringPtr *local_28;
  char (*params_local_2) [5];
  StringPtr *params_local_1;
  char (*params_local) [11];
  
  local_28 = params_1;
  params_local_2 = (char (*) [5])params;
  params_local_1 = (StringPtr *)this;
  params_local = (char (*) [11])__return_storage_ptr__;
  value = ::const((char (*) [11])this);
  local_38 = _::toStringTreeOrCharSequence<char_const(&)[11]>(value);
  value_00 = fwd<kj::StringPtr&>((StringPtr *)params_local_2);
  local_48 = _::toStringTreeOrCharSequence<kj::StringPtr&>(value_00);
  value_01 = ::const((char (*) [5])local_28);
  local_58 = _::toStringTreeOrCharSequence<char_const(&)[5]>(value_01);
  StringTree::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_38,&local_48,&local_58,
             (ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}